

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_load_module_check(ly_ctx *ctx,lysp_module *mod,lysp_submodule *submod,void *data)

{
  char *__s2;
  int iVar1;
  lysp_revision *local_98;
  lysp_revision *local_80;
  byte local_64;
  lysp_revision *revs;
  uint8_t latest_revision;
  char *name;
  lysp_load_module_check_data *info;
  void *data_local;
  lysp_submodule *submod_local;
  lysp_module *mod_local;
  ly_ctx *ctx_local;
  
  if (mod == (lysp_module *)0x0) {
    __s2 = submod->name;
    local_98 = submod->revs;
    local_64 = (byte)submod->field_0x79 >> 2 & 3;
  }
  else {
    __s2 = mod->mod->name;
    local_98 = mod->revs;
    local_64 = mod->mod->latest_revision;
  }
  if ((*data != 0) && (iVar1 = strcmp(*data,__s2), iVar1 != 0)) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Unexpected module \"%s\" parsed instead of \"%s\").",__s2,*data);
    return LY_EINVAL;
  }
  if (*(long *)((long)data + 8) == 0) {
    if (local_64 == 0) {
      return LY_EEXIST;
    }
  }
  else if ((local_98 == (lysp_revision *)0x0) ||
          (iVar1 = strcmp(*(char **)((long)data + 8),local_98->date), iVar1 != 0)) {
    local_80 = local_98;
    if (local_98 == (lysp_revision *)0x0) {
      local_80 = (lysp_revision *)0x24191b;
    }
    ly_log(ctx,LY_LLERR,LY_EINVAL,
           "Module \"%s\" parsed with the wrong revision (\"%s\" instead \"%s\").",__s2,local_80,
           *(undefined8 *)((long)data + 8));
    return LY_EINVAL;
  }
  if (submod != (lysp_submodule *)0x0) {
    if (*(long *)((long)data + 0x18) == 0) {
      __assert_fail("info->submoduleof",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                    ,0x2d7,
                    "LY_ERR lysp_load_module_check(const struct ly_ctx *, struct lysp_module *, struct lysp_submodule *, void *)"
                   );
    }
    iVar1 = strcmp(*(char **)((long)data + 0x18),submod->mod->name);
    if (iVar1 != 0) {
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
              "Included \"%s\" submodule from \"%s\" belongs-to a different module \"%s\".",
              submod->name,*(undefined8 *)((long)data + 0x18),submod->mod->name);
      return LY_EVALID;
    }
    if ((submod->field_0x79 & 1) != 0) {
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"A circular dependency (include) for module \"%s\".",
              submod->name);
      return LY_EVALID;
    }
  }
  if (*(long *)((long)data + 0x10) != 0) {
    if (local_98 == (lysp_revision *)0x0) {
      local_98 = (lysp_revision *)0x0;
    }
    ly_check_module_filename(ctx,__s2,local_98->date,*(char **)((long)data + 0x10));
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lysp_load_module_check(const struct ly_ctx *ctx, struct lysp_module *mod, struct lysp_submodule *submod, void *data)
{
    struct lysp_load_module_check_data *info = data;
    const char *name;
    uint8_t latest_revision;
    struct lysp_revision *revs;

    name = mod ? mod->mod->name : submod->name;
    revs = mod ? mod->revs : submod->revs;
    latest_revision = mod ? mod->mod->latest_revision : submod->latest_revision;

    if (info->name) {
        /* check name of the parsed model */
        if (strcmp(info->name, name)) {
            LOGERR(ctx, LY_EINVAL, "Unexpected module \"%s\" parsed instead of \"%s\").", name, info->name);
            return LY_EINVAL;
        }
    }
    if (info->revision) {
        /* check revision of the parsed model */
        if (!revs || strcmp(info->revision, revs[0].date)) {
            LOGERR(ctx, LY_EINVAL, "Module \"%s\" parsed with the wrong revision (\"%s\" instead \"%s\").", name,
                    revs ? revs[0].date : "none", info->revision);
            return LY_EINVAL;
        }
    } else if (!latest_revision) {
        /* do not log, we just need to drop the schema and use the latest revision from the context */
        return LY_EEXIST;
    }
    if (submod) {
        assert(info->submoduleof);

        /* check that the submodule belongs-to our module */
        if (strcmp(info->submoduleof, submod->mod->name)) {
            LOGVAL(ctx, LYVE_REFERENCE, "Included \"%s\" submodule from \"%s\" belongs-to a different module \"%s\".",
                    submod->name, info->submoduleof, submod->mod->name);
            return LY_EVALID;
        }
        /* check circular dependency */
        if (submod->parsing) {
            LOGVAL(ctx, LYVE_REFERENCE, "A circular dependency (include) for module \"%s\".", submod->name);
            return LY_EVALID;
        }
    }
    if (info->path) {
        ly_check_module_filename(ctx, name, revs ? revs[0].date : NULL, info->path);
    }
    return LY_SUCCESS;
}